

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O0

void printHelp(int *param_1,char ***argv,string *fileExt)

{
  char *pcVar1;
  ostream *poVar2;
  ulong uVar3;
  rep rVar4;
  string *in_RDX;
  undefined8 *in_RSI;
  Options def;
  Options *in_stack_fffffffffffffea0;
  int local_f8;
  duration<long,_std::ratio<1L,_1000L>_> local_f0;
  int local_e8;
  int local_e4;
  string *local_18;
  undefined8 *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  Options::Options(in_stack_fffffffffffffea0);
  poVar2 = std::operator<<((ostream *)&std::cout,"Usage: ");
  poVar2 = std::operator<<(poVar2,*(char **)*local_10);
  std::operator<<(poVar2," [options] ");
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"<file>.");
    std::operator<<(poVar2,local_18);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  std::operator<<((ostream *)&std::cout,"Options:\n");
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "  -h, --help\n     Print help for common options.\n  --help-all\n     Print help for all options.\n  -a\n     Satisfaction problems: Find and print all solutions.\n     Optimisation problems: Print all (sub-optimal) intermediate solutions.\n  -n <n>, --n-of-solutions <n>\n     An upper bound on the number of solutions (default "
                          );
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_f8);
  poVar2 = std::operator<<(poVar2,").\n  -v, --verbose\n     Verbose mode (default ");
  pcVar1 = "ttef_check_on";
  if (local_e4 == 0) {
    pcVar1 = "ttef_check_off";
  }
  poVar2 = std::operator<<(poVar2,pcVar1 + 0xb);
  poVar2 = std::operator<<(poVar2,
                           ").\n  -t, --time-out <n>\n     Time out in milliseconds (default ");
  rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_f0);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,rVar4);
  poVar2 = std::operator<<(poVar2,
                           ", 0 = run indefinitely).\n  --rnd-seed <n>\n     Set random seed (default "
                          );
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_e8);
  std::operator<<(poVar2,
                  "). If 0 then the current time\n     via std::time(0) is used.\n\nSearch Options:\n  -f [on|off]\n     Free search. Alternates between user-specified and activity-based\n     search when search is restarted. Restart base is set to 100.\n\nProfiler Options:\n  -cpprofiler id,port\n     Send search to CP Profiler with the given execution ID and port.\n\n"
                 );
  Options::~Options((Options *)0x28ba0a);
  return;
}

Assistant:

void printHelp(int& /*argc*/, char**& argv, const std::string& fileExt) {
	const Options def;
	std::cout << "Usage: " << argv[0] << " [options] ";
	if (!fileExt.empty()) {
		std::cout << "<file>." << fileExt;
	}
	std::cout << "\n";
	std::cout << "Options:\n";
	std::cout << "  -h, --help\n"
							 "     Print help for common options.\n"
							 "  --help-all\n"
							 "     Print help for all options.\n"
							 "  -a\n"
							 "     Satisfaction problems: Find and print all solutions.\n"
							 "     Optimisation problems: Print all (sub-optimal) intermediate solutions.\n"
							 "  -n <n>, --n-of-solutions <n>\n"
							 "     An upper bound on the number of solutions (default "
						<< def.nof_solutions
						<< ").\n"
							 "  -v, --verbose\n"
							 "     Verbose mode (default "
						<< (def.verbosity == 0 ? "off" : "on")
						<< ").\n"
							 "  -t, --time-out <n>\n"
							 "     Time out in milliseconds (default "
						<< def.time_out.count()
						<< ", 0 = run indefinitely).\n"
							 "  --rnd-seed <n>\n"
							 "     Set random seed (default "
						<< def.rnd_seed
						<< "). If 0 then the current time\n"
							 "     via std::time(0) is used.\n"
							 "\n"
							 "Search Options:\n"
							 "  -f [on|off]\n"
							 "     Free search. Alternates between user-specified and activity-based\n"
							 "     search when search is restarted. Restart base is set to 100.\n"
#ifdef HAS_PROFILER
							 "\n"
							 "Profiler Options:\n"
							 "  -cpprofiler id,port\n"
							 "     Send search to CP Profiler with the given execution ID and port.\n"
#endif
							 "\n";
}